

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::benchmarkEnded(ConsoleReporter *this,BenchmarkStats *stats)

{
  TablePrinter *pTVar1;
  ulong uVar2;
  ostream *poVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  double dVar7;
  undefined1 auVar8 [16];
  char local_40 [16];
  
  uVar2 = stats->elapsedTimeInNanoseconds / stats->iterations;
  iVar4 = 1;
  if (((999 < uVar2) && (iVar4 = 2, 999999 < uVar2)) && (iVar4 = 3, 999999999 < uVar2)) {
    iVar4 = 5 - (uint)(uVar2 >> 0xb < 0x1bf08eb);
  }
  pTVar1 = (this->m_tablePrinter)._M_t.
           super___uniq_ptr_impl<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>.
           _M_t.
           super__Tuple_impl<0UL,_Catch::TablePrinter_*,_std::default_delete<Catch::TablePrinter>_>.
           super__Head_base<0UL,_Catch::TablePrinter_*,_false>._M_head_impl;
  std::ostream::_M_insert<unsigned_long>((ulong)&pTVar1->m_oss);
  operator<<(pTVar1);
  std::ostream::_M_insert<unsigned_long>((ulong)&pTVar1->m_oss);
  operator<<(pTVar1);
  auVar8._8_4_ = (int)(uVar2 >> 0x20);
  auVar8._0_8_ = uVar2;
  auVar8._12_4_ = 0x45300000;
  dVar7 = (auVar8._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
  if (3 < iVar4 - 2U) {
    poVar3 = std::ostream::_M_insert<double>(dVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    local_40[0] = 'n';
    local_40[1] = 's';
    goto LAB_0012c3e9;
  }
  pcVar6 = local_40 + 1;
  switch(iVar4) {
  case 2:
    poVar3 = std::ostream::_M_insert<double>(dVar7 / 1000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    local_40[0] = 'u';
    local_40[1] = 's';
    break;
  case 3:
    poVar3 = std::ostream::_M_insert<double>(dVar7 / 1000000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    local_40[0] = 'm';
    local_40[1] = 's';
    break;
  case 4:
    poVar3 = std::ostream::_M_insert<double>(dVar7 / 1000000000.0);
    lVar5 = 1;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    local_40[0] = 0x73;
    goto LAB_0012c3ef;
  case 5:
    poVar3 = std::ostream::_M_insert<double>(dVar7 / 60000000000.0);
    lVar5 = 1;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    local_40[0] = 0x6d;
    goto LAB_0012c3ef;
  }
LAB_0012c3e9:
  lVar5 = 2;
  pcVar6 = local_40 + 2;
LAB_0012c3ef:
  *pcVar6 = '\0';
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_40,lVar5);
  operator<<(pTVar1);
  return;
}

Assistant:

void ConsoleReporter::benchmarkEnded(BenchmarkStats const& stats) {
    Duration average(stats.elapsedTimeInNanoseconds / stats.iterations);
    (*m_tablePrinter)
        << stats.iterations << ColumnBreak()
        << stats.elapsedTimeInNanoseconds << ColumnBreak()
        << average << ColumnBreak();
}